

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O3

void google::protobuf::compiler::java::anon_unknown_2::AddPrimitiveVariableForThisAndOther
               (string_view this_variable_name,string_view other_variable_name,
               FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>
               create_value,
               flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables)

{
  VoidPtr VVar1;
  VoidPtr c;
  type tVar2;
  type tVar3;
  string local_138;
  string local_118;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  undefined1 local_d8 [48];
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_a8;
  AlphaNum local_90;
  undefined8 local_60;
  AlphaNum *local_58;
  
  local_e8._M_str = this_variable_name._M_str;
  local_e8._M_len = this_variable_name._M_len;
  VVar1 = create_value.ptr_;
  local_f8._M_str = other_variable_name._M_str;
  local_f8._M_len = other_variable_name._M_len;
  c = VVar1;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[5]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_90,variables,(char (*) [5])0x10a9ad3);
  local_58 = *(AlphaNum **)(local_90.piece_._M_str + 0x10);
  local_60 = *(undefined8 *)(local_90.piece_._M_str + 0x18);
  local_90.piece_._M_len = 1;
  local_90.piece_._M_str = "_";
  absl::lts_20250127::StrCat_abi_cxx11_(&local_138,(lts_20250127 *)&local_60,&local_90,local_58);
  tVar2._M_str = local_138._M_dataplus._M_p;
  tVar2._M_len = local_138._M_string_length;
  (*create_value.invoker_)
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,VVar1,
             tVar2);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<std::basic_string_view<char,std::char_traits<char>>const&>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_118,variables,&local_e8);
  std::__cxx11::string::operator=((string *)(local_118._M_string_length + 0x10),(string *)local_d8);
  if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
    operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  local_60 = 9;
  local_58 = (AlphaNum *)0x134a0dd;
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[17]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)local_d8,variables,(char (*) [17])0x132b01a);
  local_90.piece_._M_str = *(char **)(local_d8._8_8_ + 0x10);
  local_90.piece_._M_len = *(size_t *)(local_d8._8_8_ + 0x18);
  local_d8._0_8_ = (pointer)0x2;
  local_d8._8_8_ = "()";
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_118,(lts_20250127 *)&local_60,&local_90,(AlphaNum *)local_d8,(AlphaNum *)c.obj);
  tVar3._M_str = local_118._M_dataplus._M_p;
  tVar3._M_len = local_118._M_string_length;
  (*create_value.invoker_)(&local_138,VVar1,tVar3);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<std::basic_string_view<char,std::char_traits<char>>const&>
            (&local_a8,variables,&local_f8);
  std::__cxx11::string::operator=
            ((string *)((long)local_a8.first.field_1.slot_ + 0x10),(string *)&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void AddPrimitiveVariableForThisAndOther(
    absl::string_view this_variable_name, absl::string_view other_variable_name,
    absl::FunctionRef<std::string(absl::string_view)> create_value,
    absl::flat_hash_map<absl::string_view, std::string>* variables) {
  (*variables)[this_variable_name] =
      create_value(absl::StrCat((*variables)["name"], "_"));
  (*variables)[other_variable_name] = create_value(
      absl::StrCat("other.get", (*variables)["capitalized_name"], "()"));
}